

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ThreadPool *pTVar1;
  ostream *poVar2;
  void *this;
  clock_t cVar3;
  int j;
  time_t tl;
  Server server;
  PARAMLIST_TYPE param_list;
  int ns;
  int ppm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
  *in_stack_fffffffffffffc38;
  Server *this_00;
  PARAMLIST_TYPE *v;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  int iVar4;
  size_t in_stack_fffffffffffffc78;
  Scene *in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffcac;
  Server *in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffd17;
  undefined4 local_14;
  int local_4;
  
  local_4 = 0;
  load_scene(in_stack_fffffffffffffc80);
  w = (scene.camera)->width;
  h = (scene.camera)->height;
  std::operator<<((ostream *)&std::cout,"max depth: ");
  v = (PARAMLIST_TYPE *)&std::cin;
  std::istream::operator>>(&std::cin,&MAX_DEP);
  std::operator<<((ostream *)&std::cout,"ppm (0 for server, >0 for rendering only): ");
  std::istream::operator>>(v,&stack0xffffffffffffffec);
  std::operator<<((ostream *)&std::cout,"no. of threads: ");
  std::istream::operator>>(v,(int *)&stack0xffffffffffffffe8);
  pTVar1 = (ThreadPool *)operator_new(200);
  ThreadPool::ThreadPool((ThreadPool *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  pool = pTVar1;
  if ((int)local_14 < 1) {
    this_00 = (Server *)&stack0xffffffffffffffa8;
    pTVar1 = pool;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           *)0x286373);
    (*(scene.camera)->_vptr_Camera[3])(scene.camera,this_00);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           *)this_00,in_stack_fffffffffffffc38);
    Server::Server((Server *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (func)pTVar1,v);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
            *)0x2863c0);
    Server::run(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    Server::~Server(this_00);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
            *)0x2863e8);
  }
  else {
    clock();
    for (iVar4 = 0; iVar4 < (int)local_14; iVar4 = iVar4 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"frame ");
      this = (void *)std::ostream::operator<<(poVar2,iVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      reshade((bool)in_stack_fffffffffffffd17);
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"done. used ");
    cVar3 = clock();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,((double)cVar3 * 1.0) / 1000000.0);
    std::operator<<(poVar2,"s\n");
  }
  return local_4;
}

Assistant:

int main(int argc,char**argv)
{
	load_scene(scene);
	w = scene.camera->width;
	h = scene.camera->height;
	std::cout << "max depth: ";
	std::cin >> MAX_DEP;
    std::cout << "ppm (0 for server, >0 for rendering only): ";
    int ppm;
    std::cin>>ppm;
	std::cout << "no. of threads: ";
	int ns;
	std::cin >> ns;
	pool = new ThreadPool(ns);
    if(ppm<=0)
    {
		PARAMLIST_TYPE param_list;
		scene.camera->dump(param_list);
        Server server(reshade, param_list);
    	server.run();
    }
    else
    {
        time_t tl=clock();
        for(int j=0;j<ppm;++j)
        {
            std::cerr<<"frame "<<j<<std::endl;
			reshade(j!=0);
        }
        std::cerr<<"done. used "<<clock()*1.0/CLOCKS_PER_SEC<<"s\n";
    }
}